

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_init_ex(uv_loop_t *loop,uv_tcp_t *tcp,uint flags)

{
  uint domain_00;
  int err;
  int domain;
  uint flags_local;
  uv_tcp_t *tcp_local;
  uv_loop_t *loop_local;
  
  domain_00 = flags & 0xff;
  if (((domain_00 == 2) || (domain_00 == 10)) || (domain_00 == 0)) {
    if ((flags & 0xffffff00) == 0) {
      uv__stream_init(loop,(uv_stream_t *)tcp,UV_TCP);
      if ((domain_00 == 0) ||
         (loop_local._4_4_ = new_socket(tcp,domain_00,0), loop_local._4_4_ == 0)) {
        loop_local._4_4_ = 0;
      }
      else {
        uv__queue_remove(&tcp->handle_queue);
        if ((tcp->io_watcher).fd != -1) {
          uv__close((tcp->io_watcher).fd);
        }
        (tcp->io_watcher).fd = -1;
      }
    }
    else {
      loop_local._4_4_ = -0x16;
    }
  }
  else {
    loop_local._4_4_ = -0x16;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_tcp_init_ex(uv_loop_t* loop, uv_tcp_t* tcp, unsigned int flags) {
  int domain;
  int err;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  if (flags & ~0xFF)
    return UV_EINVAL;

  uv__stream_init(loop, (uv_stream_t*)tcp, UV_TCP);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (domain != AF_UNSPEC) {
    err = new_socket(tcp, domain, 0);
    if (err) {
      uv__queue_remove(&tcp->handle_queue);
      if (tcp->io_watcher.fd != -1)
        uv__close(tcp->io_watcher.fd);
      tcp->io_watcher.fd = -1;
      return err;
    }
  }

  return 0;
}